

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O3

bool __thiscall Hpipe::Cond::never_checked(Cond *this,Cond *not_in)

{
  int i;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  
  uVar1 = 0;
  if (not_in == (Cond *)0x0) {
    do {
      bVar3 = ((this->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] & 1L << ((byte)uVar1 & 0x3f)) == 0
      ;
      if (!bVar3) {
        return bVar3;
      }
      bVar2 = uVar1 != 0xff;
      uVar1 = uVar1 + 1;
    } while (bVar2);
  }
  else {
    do {
      if ((((not_in->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] >> (uVar1 & 0x3f) & 1) == 0) &&
         (((this->p).super__Base_bitset<4UL>._M_w[uVar1 >> 6] & 1L << ((byte)uVar1 & 0x3f)) != 0)) {
        return false;
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 != 0x100);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Cond::never_checked( const Cond *not_in ) const {
    if ( not_in ) {
        for( int i = 0; i < p_size; ++i )
            if ( not not_in->p[ i ] and p[ i ] )
                return false;
    } else {
        for( int i = 0; i < p_size; ++i )
            if ( p[ i ] )
                return false;
    }
    return true;
}